

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I422ToARGB1555Row_C(uint8 *src_y,uint8 *src_u,uint8 *src_v,uint8 *dst_argb1555,
                        YuvConstants *yuvconstants,int width)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int local_40;
  byte local_3a;
  byte local_39;
  int x;
  uint8 r1;
  uint uStack_34;
  uint8 g1;
  uint8 b1;
  uint8 r0;
  uint8 g0;
  uint8 b0;
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8 *dst_argb1555_local;
  uint8 *src_v_local;
  uint8 *src_u_local;
  uint8 *src_y_local;
  
  uStack_34 = width;
  _b1 = yuvconstants;
  yuvconstants_local = (YuvConstants *)dst_argb1555;
  dst_argb1555_local = src_v;
  src_v_local = src_u;
  src_u_local = src_y;
  for (local_40 = 0; local_40 < (int)(uStack_34 - 1); local_40 = local_40 + 2) {
    libyuv::YuvPixel(*src_u_local,*src_v_local,*dst_argb1555_local,(uint8 *)((long)&x + 3),
                     (uint8 *)((long)&x + 2),(uint8 *)((long)&x + 1),_b1);
    libyuv::YuvPixel(src_u_local[1],*src_v_local,*dst_argb1555_local,(uint8 *)&x,&local_39,&local_3a
                     ,_b1);
    uVar1 = (uint)x._3_1_;
    x._3_1_ = (byte)((int)uVar1 >> 3);
    uVar2 = (uint)x._2_1_;
    x._2_1_ = (byte)((int)uVar2 >> 3);
    uVar3 = (uint)x._1_1_;
    x._1_1_ = (byte)((int)uVar3 >> 3);
    uVar4 = (uint)(byte)x;
    x._0_1_ = (byte)((int)uVar4 >> 3);
    uVar5 = (uint)local_39;
    local_39 = (byte)((int)uVar5 >> 3);
    uVar6 = (uint)local_3a;
    local_3a = (byte)((int)uVar6 >> 3);
    *(uint *)yuvconstants_local->kUVToB =
         (int)uVar1 >> 3 | ((int)uVar2 >> 3) << 5 | ((int)uVar3 >> 3) << 10 |
         ((int)uVar4 >> 3) << 0x10 | ((int)uVar5 >> 3) << 0x15 | ((int)uVar6 >> 3) << 0x1a |
         0x80008000;
    src_u_local = src_u_local + 2;
    src_v_local = src_v_local + 1;
    dst_argb1555_local = dst_argb1555_local + 1;
    yuvconstants_local = (YuvConstants *)(yuvconstants_local->kUVToB + 4);
  }
  if ((uStack_34 & 1) != 0) {
    libyuv::YuvPixel(*src_u_local,*src_v_local,*dst_argb1555_local,(uint8 *)((long)&x + 3),
                     (uint8 *)((long)&x + 2),(uint8 *)((long)&x + 1),_b1);
    *(ushort *)yuvconstants_local->kUVToB =
         (ushort)(byte)((int)(uint)x._3_1_ >> 3) | (ushort)(byte)((int)(uint)x._2_1_ >> 3) << 5 |
         (ushort)(byte)((int)(uint)x._1_1_ >> 3) << 10 | 0x8000;
  }
  return;
}

Assistant:

void I422ToARGB1555Row_C(const uint8* src_y,
                         const uint8* src_u,
                         const uint8* src_v,
                         uint8* dst_argb1555,
                         const struct YuvConstants* yuvconstants,
                         int width) {
  uint8 b0;
  uint8 g0;
  uint8 r0;
  uint8 b1;
  uint8 g1;
  uint8 r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 3;
    r0 = r0 >> 3;
    b1 = b1 >> 3;
    g1 = g1 >> 3;
    r1 = r1 >> 3;
    *(uint32*)(dst_argb1555) = b0 | (g0 << 5) | (r0 << 10) | (b1 << 16) |
                               (g1 << 21) | (r1 << 26) | 0x80008000;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    dst_argb1555 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 3;
    r0 = r0 >> 3;
    *(uint16*)(dst_argb1555) = b0 | (g0 << 5) | (r0 << 10) | 0x8000;
  }
}